

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdGetTapBranchHandle
              (void *handle,void *tree_handle,uint8_t index_from_leaf,char **branch_hash,
              void **branch_tree_handle)

{
  undefined **ppuVar1;
  TaprootScriptTree *this;
  bool bVar2;
  void *pvVar3;
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *this_00;
  undefined8 *puVar4;
  CfdException *pCVar5;
  ulong uVar6;
  TapBranch *pTVar7;
  char *work_branch_hash;
  ByteData256 hash_obj;
  TaprootScriptTree tree;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  char *local_100;
  ByteData256 local_f8;
  undefined1 local_e0 [128];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_60;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_48;
  
  local_100 = (char *)0x0;
  cfd::Initialize();
  ppuVar1 = (undefined **)(local_e0 + 0x10);
  local_e0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)local_e0);
  if ((undefined **)local_e0._0_8_ != ppuVar1) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if (branch_tree_handle == (void **)0x0) {
    local_e0._0_8_ = "cfdcapi_script.cpp";
    local_e0._8_4_ = 0x423;
    local_e0._16_8_ = "CfdGetTapBranchHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_e0,kCfdLogLevelWarning,
               "branch_tree_handle is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Failed to parameter. branch_tree_handle is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_e0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pTVar7 = (TapBranch *)**(long **)((long)tree_handle + 0x18);
  if (pTVar7 == (TapBranch *)(*(long **)((long)tree_handle + 0x18))[1]) {
    pTVar7 = (TapBranch *)**(long **)((long)tree_handle + 0x10);
    if ((TapBranch *)(*(long **)((long)tree_handle + 0x10))[1] == pTVar7) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
  }
  cfd::core::TapBranch::GetBranchList(&local_48,pTVar7);
  uVar6 = (long)local_48.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_start >> 7;
  if ((uint)index_from_leaf < (uint)uVar6) {
    if (uVar6 <= index_from_leaf) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    pTVar7 = local_48.
             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl
             .super__Vector_impl_data._M_start + index_from_leaf;
    cfd::core::TapBranch::GetCurrentBranchHash(&local_f8,pTVar7);
    if (branch_hash != (char **)0x0) {
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_e0,&local_f8);
      local_100 = cfd::capi::CreateString((string *)local_e0);
      if ((undefined **)local_e0._0_8_ != ppuVar1) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
    }
    local_e0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"TapscriptTree","");
    pvVar3 = cfd::capi::AllocBuffer((string *)local_e0,0x28);
    if ((undefined **)local_e0._0_8_ != ppuVar1) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    this_00 = (vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *
              )operator_new(0x18);
    std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::vector
              (this_00,1,(allocator_type *)local_e0);
    *(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> **)
     ((long)pvVar3 + 0x10) = this_00;
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    *(undefined8 **)((long)pvVar3 + 0x18) = puVar4;
    bVar2 = cfd::core::TapBranch::HasTapLeaf(pTVar7);
    if (bVar2) {
      cfd::core::TaprootScriptTree::TaprootScriptTree((TaprootScriptTree *)local_e0,pTVar7);
      this = (TaprootScriptTree *)**(undefined8 **)((long)pvVar3 + 0x10);
      if ((TaprootScriptTree *)(*(undefined8 **)((long)pvVar3 + 0x10))[1] == this) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      cfd::core::TaprootScriptTree::operator=(this,(TaprootScriptTree *)local_e0);
      local_e0._0_8_ = &PTR__TaprootScriptTree_00888598;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_60);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_e0);
    }
    else {
      std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
      emplace_back<cfd::core::TapBranch&>
                (*(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
                  ((long)pvVar3 + 0x18),pTVar7);
    }
    *branch_tree_handle = pvVar3;
    if (branch_hash != (char **)0x0) {
      *branch_hash = local_100;
    }
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_48);
    return 0;
  }
  local_e0._0_8_ = "cfdcapi_script.cpp";
  local_e0._8_4_ = 0x434;
  local_e0._16_8_ = "CfdGetTapBranchHandle";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_e0,kCfdLogLevelWarning,"index_from_leaf is out of range.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"Failed to parameter. index_from_leaf is out of range.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_e0);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTapBranchHandle(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    char** branch_hash, void** branch_tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_branch_hash = nullptr;
  CfdCapiTapscriptTree* work_branch_buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (branch_tree_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "branch_tree_handle is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_tree_handle is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    TapBranch& branch_data = branches.at(index_from_leaf);
    ByteData256 hash_obj = branch_data.GetCurrentBranchHash();
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    work_branch_buffer = static_cast<CfdCapiTapscriptTree*>(
        AllocBuffer(kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree)));
    work_branch_buffer->tree_buffer = new std::vector<TaprootScriptTree>(1);
    work_branch_buffer->branch_buffer = new std::vector<TapBranch>();
    if (branch_data.HasTapLeaf()) {
      TaprootScriptTree tree(branch_data);
      auto& dest_tree = work_branch_buffer->tree_buffer->at(0);
      dest_tree = tree;
    } else {
      work_branch_buffer->branch_buffer->emplace_back(branch_data);
    }

    *branch_tree_handle = work_branch_buffer;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_branch_hash);
  CfdFreeTaprootScriptTreeHandle(handle, work_branch_buffer);
  return result;
}